

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O2

int tc_uECC_compute_public_key(uint8_t *private_key,uint8_t *public_key,tc_uECC_Curve curve)

{
  short sVar1;
  wordcount_t num_words;
  cmpresult_t cVar2;
  tc_uECC_word_t tVar3;
  int iVar4;
  tc_uECC_word_t local_98 [2];
  tc_uECC_word_t _public [16];
  tc_uECC_word_t _private [8];
  
  sVar1 = curve->num_n_bits;
  tc_uECC_vli_bytesToNative(_public + 0xe,private_key,(sVar1 + 7) / 8);
  num_words = (wordcount_t)((sVar1 + 0x1f) / 0x20);
  tVar3 = tc_uECC_vli_isZero(_public + 0xe,num_words);
  iVar4 = 0;
  if (tVar3 == 0) {
    cVar2 = tc_uECC_vli_cmp(curve->n,_public + 0xe,num_words);
    iVar4 = 0;
    if (cVar2 == '\x01') {
      tVar3 = EccPoint_compute_public_key(local_98,_public + 0xe,curve);
      iVar4 = 0;
      if (tVar3 != 0) {
        tc_uECC_vli_nativeToBytes(public_key,(int)curve->num_bytes,local_98);
        tc_uECC_vli_nativeToBytes
                  (public_key + curve->num_bytes,(int)curve->num_bytes,
                   _public + (long)curve->num_words + -2);
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int tc_uECC_compute_public_key(const uint8_t *private_key, uint8_t *public_key,
			    tc_uECC_Curve curve)
{

	tc_uECC_word_t _private[NUM_ECC_WORDS];
	tc_uECC_word_t _public[NUM_ECC_WORDS * 2];

	tc_uECC_vli_bytesToNative(
	_private,
	private_key,
	BITS_TO_BYTES(curve->num_n_bits));

	/* Make sure the private key is in the range [1, n-1]. */
	if (tc_uECC_vli_isZero(_private, BITS_TO_WORDS(curve->num_n_bits))) {
		return 0;
	}

	if (tc_uECC_vli_cmp(curve->n, _private, BITS_TO_WORDS(curve->num_n_bits)) != 1) {
		return 0;
	}

	/* Compute public key. */
	if (!EccPoint_compute_public_key(_public, _private, curve)) {
		return 0;
	}

	tc_uECC_vli_nativeToBytes(public_key, curve->num_bytes, _public);
	tc_uECC_vli_nativeToBytes(
	public_key +
	curve->num_bytes, curve->num_bytes, _public + curve->num_words);
	return 1;
}